

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void * ma__malloc_from_callbacks(size_t sz,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_allocation_callbacks *pAllocationCallbacks_local;
  size_t sz_local;
  
  if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
    sz_local = 0;
  }
  else if (pAllocationCallbacks->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) {
    if (pAllocationCallbacks->onRealloc == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
      sz_local = 0;
    }
    else {
      sz_local = (size_t)(*pAllocationCallbacks->onRealloc)
                                   ((void *)0x0,sz,pAllocationCallbacks->pUserData);
    }
  }
  else {
    sz_local = (size_t)(*pAllocationCallbacks->onMalloc)(sz,pAllocationCallbacks->pUserData);
  }
  return (void *)sz_local;
}

Assistant:

static void* ma__malloc_from_callbacks(size_t sz, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (pAllocationCallbacks == NULL) {
        return NULL;
    }

    if (pAllocationCallbacks->onMalloc != NULL) {
        return pAllocationCallbacks->onMalloc(sz, pAllocationCallbacks->pUserData);
    }

    /* Try using realloc(). */
    if (pAllocationCallbacks->onRealloc != NULL) {
        return pAllocationCallbacks->onRealloc(NULL, sz, pAllocationCallbacks->pUserData);
    }

    return NULL;
}